

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.h
# Opt level: O2

size_t * IsoSpec::get_inverse_order<double>(double *order_array,size_t N)

{
  unsigned_long *__first;
  size_t ii;
  unsigned_long uVar1;
  double *local_20;
  
  local_20 = order_array;
  __first = (unsigned_long *)operator_new__(-(ulong)(N >> 0x3d != 0) | N * 8);
  for (uVar1 = 0; N != uVar1; uVar1 = uVar1 + 1) {
    __first[uVar1] = uVar1;
  }
  std::
  __sort<unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<IsoSpec::get_inverse_order<double>(double*,unsigned_long)::_lambda(int,int)_1_>>
            (__first,__first + N,
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MatteoLacki[P]IsoSpec_IsoSpec___misc_h:168:29)>
              )&local_20);
  return __first;
}

Assistant:

size_t* get_inverse_order(T* order_array, size_t N)
{
    size_t* arr = new size_t[N];
    for(size_t ii = 0; ii < N; ii++)
        arr[ii] = ii;

    std::sort(arr, arr + N, [&](int i, int j) { return order_array[i] > order_array[j]; });

    return arr;
}